

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManFilterEquivsForSpeculation
              (Gia_Man_t *pGia,char *pName1,char *pName2,int fLatchA,int fLatchB)

{
  Gia_Rpr_t GVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  int *piVar12;
  uint uVar13;
  ulong uVar14;
  uint Id;
  bool bVar15;
  uint local_4c;
  
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    pcVar11 = "Equivalences are not defined.\n";
LAB_001e928c:
    Abc_Print(1,pcVar11);
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      pcVar11 = "Cannot read first file %s.\n";
      pName2 = pName1;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 != (Gia_Man_t *)0x0) {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          pcVar11 = "Cannot create sequential miter.\n";
        }
        else if (pGia->nObjs == p->nObjs) {
          iVar2 = bcmp(pGia->pObjs,p->pObjs,(long)pGia->nObjs * 0xc);
          if (iVar2 == 0) {
            Gia_ManCleanMark0(pGia);
            iVar2 = 0;
            while ((iVar2 < p0->nObjs && (pGVar4 = Gia_ManObj(p0,iVar2), pGVar4 != (Gia_Obj_t *)0x0)
                   )) {
              if (pGVar4->Value != 0xffffffff) {
                iVar3 = Abc_Lit2Var(pGVar4->Value);
                pGVar4 = Gia_ManObj(p,iVar3);
                iVar3 = Gia_ObjId(p,pGVar4);
                pGVar4 = Gia_ManObj(pGia,iVar3);
                pGVar4->field_0x3 = pGVar4->field_0x3 | 0x40;
              }
              iVar2 = iVar2 + 1;
            }
            Gia_ManCleanMark1(pGia);
            iVar2 = 0;
            while ((iVar2 < p1->nObjs && (pGVar4 = Gia_ManObj(p1,iVar2), pGVar4 != (Gia_Obj_t *)0x0)
                   )) {
              if (pGVar4->Value != 0xffffffff) {
                iVar3 = Abc_Lit2Var(pGVar4->Value);
                pGVar4 = Gia_ManObj(p,iVar3);
                iVar3 = Gia_ObjId(p,pGVar4);
                pGVar4 = Gia_ManObj(pGia,iVar3);
                *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x4000000000000000;
              }
              iVar2 = iVar2 + 1;
            }
            for (lVar5 = 1; uVar7 = (ulong)pGia->nObjs, lVar5 < (long)uVar7; lVar5 = lVar5 + 1) {
              GVar1 = pGia->pReprs[lVar5];
              if ((((uint)GVar1 & 0xfffffff) == 0) &&
                 (pGia->pReprs[lVar5] = (Gia_Rpr_t)((uint)GVar1 | 0xfffffff),
                 pGia->pNexts[lVar5] != 0)) {
                __assert_fail("pGia->pNexts[i] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                              ,0x8e6,
                              "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                             );
              }
            }
            local_4c = 0;
            uVar10 = 1;
            do {
              if ((long)(int)uVar7 <= (long)uVar10) {
                Abc_Print(1,"The number of two-node classes after filtering = %d.\n",(ulong)local_4c
                         );
                Gia_ManCleanMark0(pGia);
                Gia_ManCleanMark1(pGia);
                return 1;
              }
              iVar2 = Gia_ObjIsHead(pGia,(int)uVar10);
              if (iVar2 != 0) {
                uVar7 = 0xffffffffffffffff;
                uVar14 = 0xffffffff;
                uVar9 = uVar10;
                while( true ) {
                  uVar13 = (uint)uVar14;
                  Id = (uint)uVar7;
                  if ((int)uVar9 < 1) break;
                  pGVar4 = Gia_ManObj(pGia,(int)uVar9);
                  if (uVar13 == 0xffffffff) {
                    bVar15 = ((undefined1  [12])*pGVar4 & (undefined1  [12])0x4000000040000000) !=
                             (undefined1  [12])0x40000000;
                    uVar14 = uVar9;
                    if (bVar15) {
                      uVar14 = 0xffffffffffffffff;
                    }
                    uVar14 = uVar14 & 0xffffffff;
                    if (bVar15 || fLatchA == 0) goto LAB_001e94a5;
                    iVar2 = Gia_ObjIsRo(pGia,pGVar4);
                    uVar14 = uVar9 & 0xffffffff;
                    if (iVar2 != 0) goto LAB_001e94a5;
                    uVar14 = 0xffffffffffffffff;
                  }
                  else {
LAB_001e94a5:
                    if (Id == 0xffffffff) {
                      if ((((undefined1  [12])*pGVar4 & (undefined1  [12])0x4000000040000000) ==
                           (undefined1  [12])0x4000000000000000) &&
                         ((fLatchB == 0 || (iVar2 = Gia_ObjIsRo(pGia,pGVar4), iVar2 != 0)))) {
                        uVar7 = uVar9 & 0xffffffff;
                      }
                      else {
                        uVar7 = 0xffffffffffffffff;
                      }
                    }
                  }
                  uVar9 = (ulong)(uint)pGia->pNexts[uVar9 & 0xffffffff];
                }
                piVar12 = pGia->pNexts;
                puVar6 = (uint *)(piVar12 + uVar10);
                uVar7 = uVar10 & 0xffffffff;
                while (iVar2 = (int)uVar7, iVar2 != 0) {
                  uVar8 = *puVar6;
                  pGia->pReprs[iVar2] = (Gia_Rpr_t)((uint)pGia->pReprs[iVar2] | 0xfffffff);
                  piVar12 = pGia->pNexts;
                  piVar12[iVar2] = 0;
                  puVar6 = (uint *)(piVar12 + (int)uVar8);
                  uVar7 = (ulong)uVar8;
                }
                iVar2 = Gia_ObjIsHead(pGia,(int)uVar10);
                if (iVar2 != 0) {
                  __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                ,0x903,
                                "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                               );
                }
                if ((0 < (int)uVar13) && (0 < (int)Id)) {
                  uVar8 = Id;
                  if (uVar13 < Id) {
                    uVar8 = uVar13;
                  }
                  if (Id < uVar13) {
                    Id = uVar13;
                  }
                  if (Id <= uVar8) {
                    __assert_fail("ClassA < ClassB",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                  ,0x90c,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  piVar12[uVar8] = Id;
                  Gia_ObjSetRepr(pGia,Id,uVar8);
                  iVar2 = Gia_ObjIsHead(pGia,uVar8);
                  if (iVar2 == 0) {
                    __assert_fail("Gia_ObjIsHead(pGia, ClassA)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                                  ,0x910,
                                  "int Gia_ManFilterEquivsForSpeculation(Gia_Man_t *, char *, char *, int, int)"
                                 );
                  }
                  local_4c = local_4c + 1;
                }
              }
              uVar10 = uVar10 + 1;
              uVar7 = (ulong)(uint)pGia->nObjs;
            } while( true );
          }
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar11 = "The AIG structure of the miter does not match.\n";
        }
        else {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Gia_ManStop(p);
          pcVar11 = "The number of objects in different.\n";
        }
        goto LAB_001e928c;
      }
      Gia_ManStop((Gia_Man_t *)0x0);
      pcVar11 = "Cannot read second file %s.\n";
    }
    Abc_Print(1,pcVar11,pName2);
  }
  return 0;
}

Assistant:

int Gia_ManFilterEquivsForSpeculation( Gia_Man_t * pGia, char * pName1, char * pName2, int fLatchA, int fLatchB )
{
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj;
    int i, iObj, iNext, Counter = 0;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    Gia_ManForEachConst( pGia, i )
    {
        Gia_ObjUnsetRepr( pGia, i );
        assert( pGia->pNexts[i] == 0 );
    }
    Gia_ManForEachClass( pGia, i )
    {
        // find the first colorA and colorB
        int ClassA = -1, ClassB = -1;
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( ClassA == -1 && pObj->fMark0 && !pObj->fMark1 )
            {
                if ( fLatchA && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassA = iObj;
            }
            if ( ClassB == -1 && pObj->fMark1 && !pObj->fMark0 )
            {
                if ( fLatchB && !Gia_ObjIsRo(pGia, pObj) )
                    continue;
                ClassB = iObj;
            }
        }
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( ClassA > 0 && ClassB > 0 )
        {
            if ( ClassA > ClassB )
            {
                ClassA ^= ClassB;
                ClassB ^= ClassA;
                ClassA ^= ClassB;
            }
            assert( ClassA < ClassB );
            Gia_ObjSetNext( pGia, ClassA, ClassB );
            Gia_ObjSetRepr( pGia, ClassB, ClassA );
            Counter++;
            assert( Gia_ObjIsHead(pGia, ClassA) );
        }
    }
    Abc_Print( 1, "The number of two-node classes after filtering = %d.\n", Counter );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}